

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  ChunkHeader *pCVar1;
  bool bVar2;
  void *pvVar3;
  ulong uVar4;
  ulong capacity;
  
  if (this->shared_->refcount == 0) {
    __assert_fail("shared_->refcount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0x142,
                  "void *rapidjson::MemoryPoolAllocator<>::Malloc(size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (size == 0) {
LAB_0010aa2d:
    pvVar3 = (void *)0x0;
  }
  else {
    uVar4 = size + 7 & 0xfffffffffffffff8;
    pCVar1 = this->shared_->chunkHead;
    if (pCVar1->capacity < pCVar1->size + uVar4) {
      capacity = this->chunk_capacity_;
      if (this->chunk_capacity_ <= uVar4) {
        capacity = uVar4;
      }
      bVar2 = AddChunk(this,capacity);
      if (!bVar2) goto LAB_0010aa2d;
    }
    pCVar1 = this->shared_->chunkHead;
    pvVar3 = (void *)((long)&pCVar1[1].capacity + pCVar1->size);
    pCVar1->size = uVar4 + pCVar1->size;
  }
  return pvVar3;
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }